

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void set_type_of_search(Am_Object *item,Am_Object *proto)

{
  bool bVar1;
  Am_Wrapper *value;
  ostream *poVar2;
  Am_Object local_38 [3];
  Am_Assoc local_20;
  Am_Assoc as;
  Am_Object *proto_local;
  Am_Object *item_local;
  
  as.data = (Am_Assoc_Data *)proto;
  Am_Assoc::Am_Assoc(&local_20);
  bVar1 = am_find_proto_and_name(proto,&local_20);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar2 = std::operator<<(poVar2,"proto ");
    poVar2 = operator<<(poVar2,proto);
    poVar2 = std::operator<<(poVar2," not found in proto list ");
    poVar2 = operator<<(poVar2,&am_all_proto_names);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Object::Get_Object(local_38,(Am_Slot_Key)item,(ulong)Am_ITEM_VALUE);
  value = Am_Object::operator_cast_to_Am_Wrapper_(proto);
  Am_Object::Set(local_38,0x169,value,0);
  Am_Object::~Am_Object(local_38);
  Am_Assoc::~Am_Assoc(&local_20);
  return;
}

Assistant:

void
set_type_of_search(Am_Object &item, Am_Object proto)
{
  Am_Assoc as;
  if (am_find_proto_and_name(proto, as)) {
    item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, proto);
  } else
    Am_ERROR("proto " << proto << " not found in proto list "
                      << am_all_proto_names);
}